

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall
GraphTestCycleInEdgesButNotInNodes4::~GraphTestCycleInEdgesButNotInNodes4
          (GraphTestCycleInEdgesButNotInNodes4 *this)

{
  GraphTest::~GraphTest(&this->super_GraphTest);
  operator_delete(this,0x230);
  return;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes4) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build d: cat c\n"
"build c: cat b\n"
"build b: cat a\n"
"build a e: cat d\n"
"build f: cat e\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("f"), NULL, &err));
  ASSERT_EQ("dependency cycle: a -> d -> c -> b -> a", err);
}